

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void ScalePlaneBilinearDown_16
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint16_t *src_ptr,uint16_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  int iVar2;
  int *dy_00;
  int *dx_00;
  long lVar3;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int yf;
  uint16_t *src;
  int yi;
  _func_void_uint16_t_ptr_uint16_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  _func_void_uint16_t_ptr_uint16_t_ptr_int_int_int *ScaleFilterCols;
  int j;
  int max_y;
  uint8_t *row;
  uint8_t *row_mem;
  int dy;
  int dx;
  int y;
  int x;
  code *local_70;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  FilterMode filtering_00;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  code *pcVar4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  int local_20;
  
  filtering_00 = (FilterMode)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_20 = 0;
  dy_00 = (int *)malloc((long)(in_EDI * 2 + 0x3f));
  dx_00 = (int *)((long)dy_00 + 0x3fU & 0xffffffffffffffc0);
  iVar1 = (in_ESI + -1) * 0x10000;
  if (in_EDI < 0x8000) {
    local_70 = ScaleFilterCols_16_C;
  }
  else {
    local_70 = ScaleFilterCols64_16_C;
  }
  pcVar4 = InterpolateRow_16_C;
  ScaleSlope(0,0x1457a0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,filtering_00,
             (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (int *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),dx_00,dy_00);
  iVar2 = libyuv::Abs(in_EDI);
  if (iVar1 < 0) {
    local_20 = iVar1;
  }
  for (iVar5 = 0; iVar5 < in_ECX; iVar5 = iVar5 + 1) {
    lVar3 = in_stack_00000008 + (long)((local_20 >> 0x10) * in_R8D) * 2;
    if (in_stack_00000018 == 1) {
      (*local_70)(in_stack_00000010,lVar3,in_EDX,0,0);
    }
    else {
      (*pcVar4)(dx_00,lVar3,(long)in_R8D,iVar2,local_20 >> 8 & 0xff);
      (*local_70)(in_stack_00000010,dx_00,in_EDX,0,0);
    }
    in_stack_00000010 = in_stack_00000010 + (long)in_R9D * 2;
    if (iVar1 < local_20) {
      local_20 = iVar1;
    }
  }
  free(dy_00);
  return;
}

Assistant:

void ScalePlaneBilinearDown_16(int src_width,
                               int src_height,
                               int dst_width,
                               int dst_height,
                               int src_stride,
                               int dst_stride,
                               const uint16_t* src_ptr,
                               uint16_t* dst_ptr,
                               enum FilterMode filtering) {
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  // TODO(fbarchard): Consider not allocating row buffer for kFilterLinear.
  // Allocate a row buffer.
  align_buffer_64(row, src_width * 2);

  const int max_y = (src_height - 1) << 16;
  int j;
  void (*ScaleFilterCols)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                          int dst_width, int x, int dx) =
      (src_width >= 32768) ? ScaleFilterCols64_16_C : ScaleFilterCols_16_C;
  void (*InterpolateRow)(uint16_t * dst_ptr, const uint16_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_16_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_16_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    InterpolateRow = InterpolateRow_Any_16_SSE2;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSE2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_16_SSSE3;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_16_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_16_AVX2;
    if (IS_ALIGNED(src_width, 32)) {
      InterpolateRow = InterpolateRow_16_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_16_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_16_NEON;
    if (IS_ALIGNED(src_width, 16)) {
      InterpolateRow = InterpolateRow_16_NEON;
    }
  }
#endif

#if defined(HAS_SCALEFILTERCOLS_16_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_16_SSSE3;
  }
#endif
  if (y > max_y) {
    y = max_y;
  }

  for (j = 0; j < dst_height; ++j) {
    int yi = y >> 16;
    const uint16_t* src = src_ptr + yi * src_stride;
    if (filtering == kFilterLinear) {
      ScaleFilterCols(dst_ptr, src, dst_width, x, dx);
    } else {
      int yf = (y >> 8) & 255;
      InterpolateRow((uint16_t*)row, src, src_stride, src_width, yf);
      ScaleFilterCols(dst_ptr, (uint16_t*)row, dst_width, x, dx);
    }
    dst_ptr += dst_stride;
    y += dy;
    if (y > max_y) {
      y = max_y;
    }
  }
  free_aligned_buffer_64(row);
}